

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
HdlcSimulationDataGenerator::Crc16
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  uchar local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> divisor;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&result,stream);
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&result,(uchar *)&divisor);
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&result,(uchar *)&divisor);
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_49 = 0x88;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&divisor,&local_49);
  local_49 = '\x10';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&divisor,&local_49);
  local_49 = 0x80;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&divisor,&local_49);
  CrcDivision(__return_storage_ptr__,&result,&divisor,0x10);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&divisor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

vector<U8> HdlcSimulationDataGenerator::Crc16( const vector<U8>& stream )
{
    vector<U8> result = stream;

    // Append 16 0-bits
    result.push_back( 0x00 );
    result.push_back( 0x00 );

    // ISO/IEC 13239:2002(E) page 14
    // CRC16 Divisor (17 bits) - x**16 + x**12 + x**5 + 1 (0x1021)
    vector<U8> divisor;
    divisor.push_back( 0x88 );
    divisor.push_back( 0x10 );
    divisor.push_back( 0x80 );

    vector<U8> crc16Ret = CrcDivision( result, divisor, 16 );

    return crc16Ret;
}